

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::
     merge_backward<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator buf,iterator first,iterator middle,iterator last,
               value_type depth)

{
  iterator last1;
  iterator first1;
  iterator p2_00;
  iterator p1_00;
  bool bVar1;
  long lVar2;
  BitmapArray<long> *in_RCX;
  pos_type in_R8;
  reference rVar3;
  iterator iVar4;
  int x;
  int r;
  value_type t;
  iterator bufend;
  iterator j;
  iterator k;
  iterator i;
  iterator p2;
  iterator p1;
  iterator *in_stack_fffffffffffff7e8;
  value_reference *in_stack_fffffffffffff7f0;
  value_reference *this;
  iterator *in_stack_fffffffffffff7f8;
  BitmapArray<long> *in_stack_fffffffffffff808;
  pos_type in_stack_fffffffffffff810;
  BitmapArray<long> *pBVar5;
  iterator *it;
  BitmapArray<long> *this_00;
  pos_type in_stack_fffffffffffff830;
  iterator local_7c0;
  reference local_7b0;
  iterator local_7a0;
  reference local_790;
  reference local_780;
  iterator in_stack_fffffffffffff890;
  BitmapArray<long> *in_stack_fffffffffffff8a0;
  BitmapArray<long> *in_stack_fffffffffffff8a8;
  BitmapArray<long> *in_stack_fffffffffffff8b0;
  BitmapArray<long> *in_stack_fffffffffffff8b8;
  BitmapArray<long> *in_stack_fffffffffffff8c0;
  iterator local_500;
  reference local_4f0;
  iterator local_4e0;
  reference local_4d0;
  reference local_4c0;
  reference local_4b0;
  reference local_4a0;
  iterator local_490;
  reference local_480;
  reference local_470;
  iterator local_460;
  reference local_450;
  reference local_440;
  reference local_430;
  reference local_420;
  iterator local_410;
  reference local_400;
  reference local_3f0;
  reference local_3e0;
  iterator local_3d0;
  reference local_3c0;
  reference local_3b0;
  iterator local_3a0;
  reference local_390;
  reference local_380;
  reference local_370;
  iterator local_360;
  reference local_350;
  iterator local_340;
  reference local_330;
  reference local_320;
  reference local_310;
  reference local_300;
  iterator local_2f0;
  reference local_2e0;
  reference local_2d0;
  reference local_2c0;
  iterator local_2b0;
  reference local_2a0;
  reference local_290;
  iterator local_280;
  reference local_270;
  reference local_260;
  BitmapArray<long> *local_250;
  pos_type local_248;
  BitmapArray<long> *local_240;
  pos_type local_238;
  iterator local_230;
  iterator local_220;
  iterator local_210;
  iterator local_200;
  reference local_1f0;
  iterator local_1e0;
  reference local_1d0;
  iterator local_1c0;
  iterator local_1b0;
  reference local_1a0;
  iterator local_190;
  iterator local_180;
  reference local_170;
  iterator local_160;
  reference local_150;
  iterator local_140;
  iterator local_130;
  reference local_120;
  iterator local_110;
  iterator local_100;
  reference local_f0;
  BitmapArray<long> *local_e0;
  pos_type local_d8;
  _func_int **local_d0;
  data_type *local_c8;
  BitmapArray<long> *local_c0;
  pos_type local_b8;
  iterator local_b0;
  uint local_a0;
  int local_9c;
  value_reference *local_98;
  iterator local_90;
  iterator local_80;
  iterator local_70;
  iterator local_60;
  iterator local_50;
  iterator local_40 [2];
  iterator local_20 [2];
  
  this_00 = (BitmapArray<long> *)&stack0x00000028;
  it = (iterator *)&stack0x00000018;
  pBVar5 = (BitmapArray<long> *)&stack0x00000008;
  local_20[0].array_ = in_RCX;
  local_20[0].pos_ = in_R8;
  bitmap::BitmapArray<long>::iterator::iterator(local_40);
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  bitmap::BitmapArray<long>::iterator::iterator(&local_60);
  bitmap::BitmapArray<long>::iterator::iterator(&local_70);
  bitmap::BitmapArray<long>::iterator::iterator(&local_80);
  bitmap::BitmapArray<long>::iterator::iterator(&local_90);
  bitmap::BitmapArray<long>::iterator::operator-((iterator *)this_00,it);
  local_b0 = bitmap::BitmapArray<long>::iterator::operator+
                       (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  bitmap::BitmapArray<long>::iterator::operator=(&local_90,&local_b0);
  local_c0 = it->array_;
  local_b8 = it->pos_;
  local_d0 = (this_00->super_Bitmap)._vptr_Bitmap;
  local_c8 = (this_00->super_Bitmap).data_;
  local_e0 = local_20[0].array_;
  local_d8 = local_20[0].pos_;
  first1.pos_ = in_stack_fffffffffffff830;
  first1.array_ = this_00;
  last1.pos_ = (pos_type)it;
  last1.array_ = pBVar5;
  iVar4.pos_ = in_stack_fffffffffffff810;
  iVar4.array_ = in_stack_fffffffffffff808;
  helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
            (first1,last1,iVar4);
  local_a0 = 0;
  local_100 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  local_f0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c947);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c964);
  if (lVar2 < 0) {
    local_a0 = local_a0 | 1;
    local_130 = bitmap::BitmapArray<long>::iterator::operator-
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    local_120 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11c9ae);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11c9cb);
    local_110 = bitmap::BitmapArray<long>::iterator::operator+
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    bitmap::BitmapArray<long>::iterator::operator=(local_40,&local_110);
  }
  else {
    local_160 = bitmap::BitmapArray<long>::iterator::operator-
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    local_150 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11ca38);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11ca55);
    local_140 = bitmap::BitmapArray<long>::iterator::operator+
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    bitmap::BitmapArray<long>::iterator::operator=(local_40,&local_140);
  }
  local_180 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  local_170 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cab6);
  lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11cad3);
  if (lVar2 < 0) {
    local_a0 = local_a0 | 2;
    local_1b0 = bitmap::BitmapArray<long>::iterator::operator-
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    local_1a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cb1a);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11cb37);
    local_190 = bitmap::BitmapArray<long>::iterator::operator+
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_190);
  }
  else {
    local_1e0 = bitmap::BitmapArray<long>::iterator::operator-
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    local_1d0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cb9e);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11cbbb);
    local_1c0 = bitmap::BitmapArray<long>::iterator::operator+
                          (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
    bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_1c0);
  }
  local_200 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  local_1f0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cc1c);
  local_98 = (value_reference *)
             bitmap::BitmapArray::value_reference::operator_cast_to_long
                       ((value_reference *)0x11cc39);
  local_210 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  bitmap::BitmapArray<long>::iterator::operator=(&local_60,&local_210);
  local_220 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  bitmap::BitmapArray<long>::iterator::operator=(&local_80,&local_220);
  local_230 = bitmap::BitmapArray<long>::iterator::operator-
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
  bitmap::BitmapArray<long>::iterator::operator=(&local_70,&local_230);
  while( true ) {
    while( true ) {
      while( true ) {
        local_240 = local_40[0].array_;
        local_238 = local_40[0].pos_;
        local_250 = local_50.array_;
        local_248 = local_50.pos_;
        p1_00.pos_ = (pos_type)in_stack_fffffffffffff8c0;
        p1_00.array_ = in_stack_fffffffffffff8b8;
        p2_00.pos_ = (pos_type)in_stack_fffffffffffff8b0;
        p2_00.array_ = in_stack_fffffffffffff8a8;
        local_9c = compare<char*,bitmap::BitmapArray<long>::iterator>
                             ((char *)in_stack_fffffffffffff8a0,p1_00,p2_00,
                              in_stack_fffffffffffff890.pos_);
        if (local_9c < 1) break;
        if ((local_a0 & 1) != 0) {
          do {
            local_260 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cd8c);
            local_280 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0)
            ;
            local_270 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cdc8);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
            local_290 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cdfa);
            local_2b0 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0)
            ;
            local_2a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11ce36);
            bitmap::BitmapArray<long>::value_reference::operator=
                      (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
            local_2c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11ce68);
            lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                              ((value_reference *)0x11ce85);
          } while (lVar2 < 0);
          local_a0 = local_a0 ^ 1;
        }
        local_2d0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cead);
        local_2f0 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
        local_2e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cee9);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        local_300 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cf1b);
        local_310 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cf38);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                          ((iterator *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
        if (bVar1) {
          local_320 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cf92);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff7f0,(long)in_stack_fffffffffffff7e8);
          return;
        }
        bitmap::BitmapArray<long>::iterator::operator--(&local_80);
        local_330 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11cfce);
        lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11cfeb);
        if (lVar2 < 0) {
          local_a0 = local_a0 | 1;
          local_350 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d00f);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11d02c);
          local_340 = bitmap::BitmapArray<long>::iterator::operator+
                                (in_stack_fffffffffffff7f8,
                                 (difference_type)in_stack_fffffffffffff7f0);
          bitmap::BitmapArray<long>::iterator::operator=(local_40,&local_340);
        }
        else {
          local_370 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d074);
          bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11d091);
          local_360 = bitmap::BitmapArray<long>::iterator::operator+
                                (in_stack_fffffffffffff7f8,
                                 (difference_type)in_stack_fffffffffffff7f0);
          bitmap::BitmapArray<long>::iterator::operator=(local_40,&local_360);
        }
      }
      if (-1 < local_9c) break;
      if ((local_a0 & 2) != 0) {
        do {
          local_380 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d0fb);
          local_3a0 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
          local_390 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d137);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
          local_3b0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d169);
          local_3d0 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
          local_3c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d1a5);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
          local_3e0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d1d7);
          lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x11d1f4);
        } while (lVar2 < 0);
        local_a0 = local_a0 ^ 2;
      }
      local_3f0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d21c);
      local_410 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
      local_400 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d258);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
      local_420 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d28a);
      local_430 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d2a7);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
      bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                        ((iterator *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
      if (bVar1) {
        while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(local_20,&local_80), bVar1) {
          local_440 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d314);
          local_460 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
          local_450 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d350);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
          local_470 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d382);
          local_490 = bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
          local_480 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d3be);
          bitmap::BitmapArray<long>::value_reference::operator=
                    (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        }
        local_4a0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d3f5);
        local_4b0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d412);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        local_4c0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d451);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(long)in_stack_fffffffffffff7e8);
        return;
      }
      bitmap::BitmapArray<long>::iterator::operator--(&local_70);
      local_4d0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d48d);
      lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x11d4aa);
      if (lVar2 < 0) {
        local_a0 = local_a0 | 2;
        local_4f0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d4ce);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11d4eb);
        local_4e0 = bitmap::BitmapArray<long>::iterator::operator+
                              (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0)
        ;
        bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_4e0);
      }
      else {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d533);
        bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11d550);
        local_500 = bitmap::BitmapArray<long>::iterator::operator+
                              (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0)
        ;
        bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_500);
      }
    }
    if ((local_a0 & 1) != 0) {
      do {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d5ac);
        bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d5e8);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d61a);
        bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d656);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d688);
        lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11d6a5);
      } while (lVar2 < 0);
      local_a0 = local_a0 ^ 1;
    }
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d6cd);
    bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11d6ea);
    bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d71f);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(long)in_stack_fffffffffffff7e8);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d74e);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d76b);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                      ((iterator *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    if (bVar1) {
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d7c5);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffff7f0,(long)in_stack_fffffffffffff7e8);
      return;
    }
    bitmap::BitmapArray<long>::iterator::operator--(&local_80);
    if ((local_a0 & 2) != 0) {
      do {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d81b);
        bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d857);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d889);
        bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d8c5);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d8f7);
        lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x11d914);
      } while (lVar2 < 0);
      local_a0 = local_a0 ^ 2;
    }
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d93c);
    bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d978);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d9aa);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11d9c7);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                      ((iterator *)in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
    if (bVar1) break;
    bitmap::BitmapArray<long>::iterator::operator--(&local_70);
    rVar3 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dbb2);
    in_stack_fffffffffffff8c0 = rVar3.array_;
    lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dbcf)
    ;
    if (lVar2 < 0) {
      local_a0 = local_a0 | 1;
      rVar3 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dbf3);
      in_stack_fffffffffffff8a0 = rVar3.array_;
      in_stack_fffffffffffff8a8 = (BitmapArray<long> *)rVar3.pos_;
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dc10);
      iVar4 = bitmap::BitmapArray<long>::iterator::operator+
                        (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
      in_stack_fffffffffffff8b0 = iVar4.array_;
      in_stack_fffffffffffff8b8 = (BitmapArray<long> *)iVar4.pos_;
      bitmap::BitmapArray<long>::iterator::operator=(local_40,(iterator *)&stack0xfffffffffffff8b0);
    }
    else {
      local_780 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dc58);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dc75);
      in_stack_fffffffffffff890 =
           bitmap::BitmapArray<long>::iterator::operator+
                     (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
      bitmap::BitmapArray<long>::iterator::operator=(local_40,(iterator *)&stack0xfffffffffffff890);
    }
    local_790 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dcb7);
    lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dcd4)
    ;
    if (lVar2 < 0) {
      local_a0 = local_a0 | 2;
      local_7b0 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dcf8);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dd0c);
      local_7a0 = bitmap::BitmapArray<long>::iterator::operator+
                            (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_7a0);
    }
    else {
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dd4e);
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x11dd62);
      local_7c0 = bitmap::BitmapArray<long>::iterator::operator+
                            (in_stack_fffffffffffff7f8,(difference_type)in_stack_fffffffffffff7f0);
      bitmap::BitmapArray<long>::iterator::operator=(&local_50,&local_7c0);
    }
  }
  while (bVar1 = bitmap::BitmapArray<long>::iterator::operator<(local_20,&local_80), bVar1) {
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11da34);
    bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11da70);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11daa2);
    bitmap::BitmapArray<long>::iterator::operator--(in_stack_fffffffffffff7e8,0);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11dade);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
  }
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11db15);
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11db32);
  bitmap::BitmapArray<long>::value_reference::operator=
            (in_stack_fffffffffffff7f0,(value_reference *)in_stack_fffffffffffff7e8);
  this = local_98;
  bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11db71);
  bitmap::BitmapArray<long>::value_reference::operator=(this,(long)in_stack_fffffffffffff7e8);
  return;
}

Assistant:

void merge_backward(
    const StringIterator_type T, const SAIterator_type PA, BufIterator_type buf,
    SAIterator_type first, SAIterator_type middle, SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type p1, p2;
  SAIterator_type i, k;
  BufIterator_type j, bufend;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r, x;

  bufend = buf + (last - middle);
  helper::vecswap(middle, last, buf);

  x = 0;
  if (*(bufend - 1) < 0) {
    x |= 1;
    p1 = PA + ~*(bufend - 1);
  } else {
    p1 = PA + *(bufend - 1);
  }
  if (*(middle - 1) < 0) {
    x |= 2;
    p2 = PA + ~*(middle - 1);
  } else {
    p2 = PA + *(middle - 1);
  }
  for (t = *(last - 1), i = last - 1, j = bufend - 1, k = middle - 1;;) {

    r = compare(T, p1, p2, depth);
    if (r > 0) {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = *j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }

      if (*--j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
    } else if (r < 0) {
      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }

      if (*--k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    } else {
      if (x & 1) {
        do {
          *i-- = *j;
          *j-- = *i;
        } while (*j < 0);
        x ^= 1;
      }
      *i-- = ~*j;
      *j = *i;
      if (j <= buf) {
        *buf = t;
        return;
      }
      --j;

      if (x & 2) {
        do {
          *i-- = *k;
          *k-- = *i;
        } while (*k < 0);
        x ^= 2;
      }
      *i-- = *k;
      *k = *i;
      if (k <= first) {
        while (buf < j) {
          *i-- = *j;
          *j-- = *i;
        }
        *i = *j, *buf = t;
        return;
      }
      --k;

      if (*j < 0) {
        x |= 1;
        p1 = PA + ~*j;
      } else {
        p1 = PA + *j;
      }
      if (*k < 0) {
        x |= 2;
        p2 = PA + ~*k;
      } else {
        p2 = PA + *k;
      }
    }
  }
}